

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O3

bool __thiscall re2::Tester::TestInput(Tester *this,StringPiece *text)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  StringPiece local_40;
  
  lVar2 = 0;
  bVar3 = true;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    bVar1 = TestCase(this,text,text,(&anchors)[lVar2]);
    bVar3 = (bool)(bVar3 & bVar1);
    lVar2 = 1;
    bVar1 = false;
  } while (bVar4);
  if (0 < text->length_) {
    local_40.ptr_ = text->ptr_ + 1;
    local_40.length_ = text->length_ + -1;
    lVar2 = 0;
    bVar5 = 1;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      bVar1 = TestCase(this,&local_40,text,(&anchors)[lVar2]);
      bVar5 = bVar5 & bVar1;
      lVar2 = 1;
      bVar1 = false;
    } while (bVar4);
    local_40.ptr_ = text->ptr_;
    local_40.length_ = text->length_ + -1;
    lVar2 = 0;
    bVar6 = 1;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      bVar1 = TestCase(this,&local_40,text,(&anchors)[lVar2]);
      bVar6 = bVar6 & bVar1;
      lVar2 = 1;
      bVar1 = false;
    } while (bVar4);
    bVar3 = (bool)(bVar3 & bVar5 & bVar6);
  }
  return bVar3;
}

Assistant:

bool Tester::TestInput(const StringPiece& text) {
  bool okay = TestInputInContext(text, text);
  if (text.size() > 0) {
    StringPiece sp;
    sp = text;
    sp.remove_prefix(1);
    okay &= TestInputInContext(sp, text);
    sp = text;
    sp.remove_suffix(1);
    okay &= TestInputInContext(sp, text);
  }
  return okay;
}